

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnArrayType
          (BinaryReaderIR *this,Index index,TypeMut type_mut)

{
  Module *this_00;
  pointer pAVar1;
  pointer pTVar2;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_60;
  unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_> local_58;
  unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_> array_type;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> local_30;
  unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_> field;
  Index index_local;
  BinaryReaderIR *this_local;
  bool bStack_10;
  TypeMut type_mut_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TypeModuleField_*,_std::default_delete<wabt::TypeModuleField>_>.
  super__Head_base<0UL,_wabt::TypeModuleField_*,_false>._M_head_impl._4_4_ = index;
  GetLocation((Location *)&array_type,this);
  MakeUnique<wabt::TypeModuleField,wabt::Location>((wabt *)&local_30,(Location *)&array_type);
  MakeUnique<wabt::ArrayType>();
  pAVar1 = std::unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_>::operator->
                     (&local_58);
  this_local._4_4_ = type_mut.type.enum_;
  (pAVar1->field).type.enum_ = this_local._4_4_;
  bStack_10 = type_mut.mutable_;
  pAVar1 = std::unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_>::operator->
                     (&local_58);
  (pAVar1->field).mutable_ = (bool)(bStack_10 & 1);
  pTVar2 = std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::
           operator->(&local_30);
  std::unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>>::operator=
            ((unique_ptr<wabt::TypeEntry,std::default_delete<wabt::TypeEntry>> *)&pTVar2->type,
             &local_58);
  this_00 = this->module_;
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::unique_ptr
            (&local_60,&local_30);
  Module::AppendField(this_00,&local_60);
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
            (&local_60);
  Result::Result((Result *)&type_mut_local,Ok);
  std::unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_>::~unique_ptr(&local_58);
  std::unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>::~unique_ptr
            (&local_30);
  return (Result)type_mut_local.type.enum_;
}

Assistant:

Result BinaryReaderIR::OnArrayType(Index index, TypeMut type_mut) {
  auto field = MakeUnique<TypeModuleField>(GetLocation());
  auto array_type = MakeUnique<ArrayType>();
  array_type->field.type = type_mut.type;
  array_type->field.mutable_ = type_mut.mutable_;
  field->type = std::move(array_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}